

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwritefile.cpp
# Opt level: O1

bool WriteBinaryFile(path *filename,string *data)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  FILE *__s;
  size_t sVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = fsbridge::fopen((char *)filename,"wb");
  if (__s == (FILE *)0x0) {
    bVar3 = false;
  }
  else {
    sVar5 = fwrite((data->_M_dataplus)._M_p,1,data->_M_string_length,__s);
    sVar2 = data->_M_string_length;
    iVar4 = fclose(__s);
    bVar3 = iVar4 == 0 && sVar5 == sVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteBinaryFile(const fs::path &filename, const std::string &data)
{
    FILE *f = fsbridge::fopen(filename, "wb");
    if (f == nullptr)
        return false;
    if (fwrite(data.data(), 1, data.size(), f) != data.size()) {
        fclose(f);
        return false;
    }
    if (fclose(f) != 0) {
        return false;
    }
    return true;
}